

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioFunc.c
# Opt level: O2

int Mio_GateCollectNames(char *pFormula,char **pPinNames)

{
  byte bVar1;
  int iVar2;
  byte *__ptr;
  byte *pbVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  __ptr = (byte *)Abc_UtilStrsav(pFormula);
  pbVar3 = __ptr;
  do {
    bVar1 = *pbVar3;
    if ((((bVar1 - 0x26 < 6) || (bVar1 == 0x21)) || (bVar1 == 0x5e)) || (bVar1 == 0x7c)) {
      *pbVar3 = 0x20;
    }
    else if (bVar1 == 0) {
      uVar6 = 0;
      pbVar3 = __ptr;
      do {
        pcVar4 = strtok((char *)pbVar3," ");
        if (pcVar4 == (char *)0x0) {
          free(__ptr);
          return (int)uVar6;
        }
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          iVar2 = strcmp(pcVar4,pPinNames[uVar5]);
          if (iVar2 == 0) goto LAB_006ed33b;
        }
        uVar5 = uVar6 & 0xffffffff;
LAB_006ed33b:
        pbVar3 = (byte *)0x0;
        if ((int)uVar5 == (int)uVar6) {
          pcVar4 = Abc_UtilStrsav(pcVar4);
          uVar5 = uVar6 & 0xffffffff;
          uVar6 = uVar6 + 1;
          pPinNames[uVar5] = pcVar4;
          pbVar3 = (byte *)0x0;
        }
      } while( true );
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

int Mio_GateCollectNames( char * pFormula, char * pPinNames[] )
{
    char * Buffer;
    char * pTemp;
    int nPins, i;

    // save the formula as it was
    //strcpy( Buffer, pFormula );
    Buffer = Abc_UtilStrsav( pFormula );

    // remove the non-name symbols
    for ( pTemp = Buffer; *pTemp; pTemp++ )
        if ( *pTemp == MIO_SYMB_AND  || *pTemp == MIO_SYMB_AND2   || 
             *pTemp == MIO_SYMB_OR   || *pTemp == MIO_SYMB_OR2    || 
             *pTemp == MIO_SYMB_XOR  || 
             *pTemp == MIO_SYMB_NOT  || *pTemp == MIO_SYMB_AFTNOT ||
             *pTemp == MIO_SYMB_OPEN || *pTemp == MIO_SYMB_CLOSE )
             *pTemp = ' ';

    // save the names
    nPins = 0;
    pTemp = strtok( Buffer, " " );
    while ( pTemp )
    {
        for ( i = 0; i < nPins; i++ )
            if ( strcmp( pTemp, pPinNames[i] ) == 0 )
                break;
        if ( i == nPins )
        { // cannot find this name; save it
            pPinNames[nPins++] = Abc_UtilStrsav(pTemp);
        }
        // get the next name
        pTemp = strtok( NULL, " " );
    }
    ABC_FREE( Buffer );
    return nPins;
}